

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyperGraph.h
# Opt level: O2

void __thiscall HyperGraph::init_hypergraph(HyperGraph *this)

{
  pointer pvVar1;
  ulong uVar2;
  size_t sVar3;
  const_iterator __begin1;
  pointer pvVar4;
  allocator_type local_39;
  _Bvector_base<std::allocator<bool>_> local_38;
  
  sVar3 = this->__numE;
  pvVar4 = (this->_graph->
           super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (this->_graph->
           super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  uVar2 = ((long)pvVar1 - (long)pvVar4) / 0x18;
  this->__numV = (uint32_t)uVar2;
  for (; pvVar4 != pvVar1; pvVar4 = pvVar4 + 1) {
    sVar3 = sVar3 + ((long)(pvVar4->
                           super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pvVar4->
                           super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                           )._M_impl.super__Vector_impl_data._M_start >> 3);
    this->__numE = sVar3;
  }
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)&local_38,uVar2 & 0xffffffff,&local_39);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::_M_move_assign(&this->_FRsets,&local_38);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)&local_38);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&local_38,(ulong)this->__numV,
             (allocator_type *)&local_39);
  std::vector<bool,_std::allocator<bool>_>::operator=
            (&this->__vecVisitBool,(vector<bool,_std::allocator<bool>_> *)&local_38);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_38);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_38,(ulong)this->__numV,
             (allocator_type *)&local_39);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            (&this->__vecVisitNode,&local_38);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_38);
  return;
}

Assistant:

void init_hypergraph()
    {
        __numV = (uint32_t)_graph.size();
        for (auto& nbrs : _graph) __numE += nbrs.size();
        _FRsets = FRsets(__numV);
        __vecVisitBool = std::vector<bool>(__numV);
        __vecVisitNode = Nodelist(__numV);
    }